

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O1

h2o_cache_ref_t *
h2o_cache_fetch(h2o_cache_t *cache,uint64_t now,h2o_iovec_t key,h2o_cache_hashcode_t keyhash)

{
  uint uVar1;
  uint uVar2;
  kh_cache_t *pkVar3;
  khint32_t *pkVar4;
  st_h2o_linklist_t *psVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  h2o_cache_ref_t *phVar14;
  
  if (keyhash == 0) {
    keyhash = 0;
    for (sVar8 = key.len; sVar8 != 0; sVar8 = sVar8 - 1) {
      keyhash = (uint)(byte)key.base[sVar8 - 1] + keyhash * 0x1f;
    }
  }
  if ((cache->flags & 1) != 0) {
    pthread_mutex_lock((pthread_mutex_t *)&cache->mutex);
  }
  purge(cache,now);
  pkVar3 = cache->table;
  uVar1 = pkVar3->n_buckets;
  if (uVar1 == 0) {
    uVar6 = 0;
  }
  else {
    uVar12 = keyhash & uVar1 - 1;
    pkVar4 = pkVar3->flags;
    iVar13 = 1;
    uVar11 = uVar12;
    do {
      uVar2 = pkVar4[uVar11 >> 4];
      bVar10 = (char)uVar11 * '\x02' & 0x1e;
      uVar6 = uVar2 >> bVar10;
      if ((uVar6 & 2) != 0) {
LAB_00125588:
        uVar6 = uVar11;
        if ((uVar2 >> bVar10 & 3) != 0) {
          uVar6 = uVar1;
        }
        break;
      }
      if ((uVar6 & 1) == 0) {
        sVar8 = (pkVar3->keys[uVar11]->key).len;
        if ((sVar8 == key.len) &&
           (iVar7 = bcmp((pkVar3->keys[uVar11]->key).base,key.base,sVar8), iVar7 == 0))
        goto LAB_00125588;
      }
      uVar11 = uVar11 + iVar13 & uVar1 - 1;
      iVar13 = iVar13 + 1;
      uVar6 = uVar1;
    } while (uVar11 != uVar12);
  }
  if (uVar6 != uVar1) {
    phVar14 = pkVar3->keys[uVar6];
    lVar9 = (phVar14->at - now) + cache->duration;
    if (-1 < lVar9) {
      if (((9 < lVar9) || ((cache->flags & 2U) == 0)) || (phVar14->_requested_early_update != 0)) {
        psVar5 = (phVar14->_lru_link).next;
        psVar5->prev = (phVar14->_lru_link).prev;
        ((phVar14->_lru_link).prev)->next = psVar5;
        (phVar14->_lru_link).next = (st_h2o_linklist_t *)0x0;
        (phVar14->_lru_link).prev = (st_h2o_linklist_t *)0x0;
        psVar5 = (cache->lru).prev;
        (phVar14->_lru_link).prev = psVar5;
        (phVar14->_lru_link).next = &cache->lru;
        psVar5->next = &phVar14->_lru_link;
        ((phVar14->_lru_link).next)->prev = &phVar14->_lru_link;
        LOCK();
        phVar14->_refcnt = phVar14->_refcnt + 1;
        UNLOCK();
        goto LAB_0012561f;
      }
      phVar14->_requested_early_update = 1;
    }
  }
  phVar14 = (h2o_cache_ref_t *)0x0;
LAB_0012561f:
  if ((cache->flags & 1) != 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&cache->mutex);
  }
  return phVar14;
}

Assistant:

h2o_cache_ref_t *h2o_cache_fetch(h2o_cache_t *cache, uint64_t now, h2o_iovec_t key, h2o_cache_hashcode_t keyhash)
{
    h2o_cache_ref_t search_key, *ref;
    khiter_t iter;
    int64_t timeleft;

    if (keyhash == 0)
        keyhash = h2o_cache_calchash(key.base, key.len);
    search_key.key = key;
    search_key.keyhash = keyhash;

    lock_cache(cache);

    purge(cache, now);

    if ((iter = kh_get(cache, cache->table, &search_key)) == kh_end(cache->table))
        goto NotFound;

    /* found */
    ref = kh_key(cache->table, iter);
    timeleft = get_timeleft(cache, ref, now);
    if (timeleft < 0)
        goto NotFound;
    if ((cache->flags & H2O_CACHE_FLAG_EARLY_UPDATE) != 0 && timeleft < 10 && !ref->_requested_early_update) {
        ref->_requested_early_update = 1;
        goto NotFound;
    }
    /* move the entry to the top of LRU */
    h2o_linklist_unlink(&ref->_lru_link);
    h2o_linklist_insert(&cache->lru, &ref->_lru_link);
    __sync_fetch_and_add(&ref->_refcnt, 1);

    /* unlock and return the found entry */
    unlock_cache(cache);
    return ref;

NotFound:
    unlock_cache(cache);
    return NULL;
}